

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

TValue * index2adr(lua_State *L,int idx)

{
  GCObject *pGVar1;
  TValue *local_48;
  Closure *func_1;
  TValue *i_o;
  Closure *func;
  TValue *o;
  int idx_local;
  lua_State *L_local;
  TValue *local_8;
  
  if (idx < 1) {
    if (idx < -9999) {
      if (idx == -0x2712) {
        local_8 = &L->l_gt;
      }
      else if (idx == -0x2711) {
        (L->env).value = (Value)(((L->ci->func->value).gc)->h).array;
        (L->env).tt = 5;
        local_8 = &L->env;
      }
      else if (idx == -10000) {
        local_8 = &L->l_G->l_registry;
      }
      else {
        pGVar1 = (L->ci->func->value).gc;
        if ((int)(uint)(pGVar1->h).lsizenode < -idx + -0x2712) {
          local_48 = &luaO_nilobject_;
        }
        else {
          local_48 = (TValue *)((long)pGVar1 + (long)(-idx + -0x2713) * 0x10 + 0x28);
        }
        local_8 = local_48;
      }
    }
    else {
      local_8 = L->top + idx;
    }
  }
  else {
    local_8 = L->base + (idx + -1);
    if (L->top <= local_8) {
      local_8 = &luaO_nilobject_;
    }
  }
  return local_8;
}

Assistant:

static TValue*index2adr(lua_State*L,int idx){
if(idx>0){
TValue*o=L->base+(idx-1);
luai_apicheck(L,idx<=L->ci->top-L->base);
if(o>=L->top)return cast(TValue*,(&luaO_nilobject_));
else return o;
}
else if(idx>(-10000)){
luai_apicheck(L,idx!=0&&-idx<=L->top-L->base);
return L->top+idx;
}
else switch(idx){
case(-10000):return registry(L);
case(-10001):{
Closure*func=curr_func(L);
sethvalue(L,&L->env,func->c.env);
return&L->env;
}
case(-10002):return gt(L);
default:{
Closure*func=curr_func(L);
idx=(-10002)-idx;
return(idx<=func->c.nupvalues)
?&func->c.upvalue[idx-1]
:cast(TValue*,(&luaO_nilobject_));
}
}
}